

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O1

void __thiscall CDT::test(CDT *this,ostream *out,DataSet *dataset)

{
  double dVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  ostream *poVar3;
  uint index;
  uint uVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Shape SVar5;
  vector<Matrix<double>,_std::allocator<Matrix<double>_>_> matrices;
  char local_79;
  double local_78;
  vector<Matrix<double>,_std::allocator<Matrix<double>_>_> local_70;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  SVar5 = DataSet::shape(dataset);
  DataSet::compile(&local_70,dataset,1);
  if (SVar5.n_row == 0) {
    local_78 = 0.0;
  }
  else {
    index = 0;
    uVar4 = 0;
    do {
      pvVar2 = Matrix<double>::operator[]
                         (local_70.
                          super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>.
                          _M_impl.super__Vector_impl_data._M_start,index);
      local_78 = feed_forward(this,pvVar2);
      pvVar2 = Matrix<double>::operator[]
                         (local_70.
                          super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>.
                          _M_impl.super__Vector_impl_data._M_start + 1,index);
      dVar1 = ceil(local_78);
      local_48._8_4_ = extraout_XMM0_Dc;
      local_48._0_8_ = dVar1;
      local_48._12_4_ = extraout_XMM0_Dd;
      local_58._8_4_ = extraout_XMM0_Dc;
      local_58._0_8_ = dVar1 - local_78;
      local_58._12_4_ = extraout_XMM0_Dd;
      dVar1 = floor(local_78);
      uVar4 = uVar4 + ((int)((double)(~-(ulong)((double)local_58._0_8_ < 0.5) & (ulong)dVar1 |
                                     local_48._0_8_ & -(ulong)((double)local_58._0_8_ < 0.5)) -
                            *(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start) == 0);
      index = index + 1;
    } while (SVar5.n_row != index);
    local_78 = (double)uVar4;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"Accuracy: ",10);
  poVar3 = std::ostream::_M_insert<double>(local_78 / (double)(SVar5._0_8_ & 0xffffffff));
  local_79 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_79,1);
  std::vector<Matrix<double>,_std::allocator<Matrix<double>_>_>::~vector(&local_70);
  return;
}

Assistant:

void CDT::test(std::ostream& out, const DataSet& dataset) const{
    unsigned all_guesses=dataset.shape().n_row;
    unsigned right_guesses=0;

    std::vector<Matrix_d> matrices=dataset.compile();
    for(unsigned i=0;i<all_guesses;++i){
        double output=predict(matrices[0][i]);
        // std::cout<<" : "<<output<<" vs "<<matrices[1][i][0]<<'\n';
        if(ceil(output)-output<0.5) output=ceil(output);
        else output=floor(output);
        if(abs(output-matrices[1][i][0])<0.00001){
            // std::cout<<"+\n";
            ++right_guesses;
        }
    }

    out<<"Accuracy: "<<(double)right_guesses/all_guesses<<'\n';
}